

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O0

int nni_tcp_dialer_alloc(nng_stream_dialer **dp,nng_url *url)

{
  size_t sVar1;
  char *pcVar2;
  tcp_dialer *ptStack_28;
  int rv;
  tcp_dialer *d;
  nng_url *url_local;
  nng_stream_dialer **dp_local;
  
  d = (tcp_dialer *)url;
  url_local = (nng_url *)dp;
  dp_local._4_4_ = tcp_dialer_alloc(&stack0xffffffffffffffd8);
  if (dp_local._4_4_ == 0) {
    if (((*(int *)&(d->ops).sd_dial == 0) || (sVar1 = strlen((char *)(d->ops).sd_stop), sVar1 == 0))
       || (sVar1 = strlen((char *)(d->ops).sd_stop), 0xff < sVar1)) {
      tcp_dialer_free(ptStack_28);
      dp_local._4_4_ = 0xf;
    }
    else {
      pcVar2 = strchr((char *)(d->ops).sd_free,0x34);
      if (pcVar2 == (char *)0x0) {
        pcVar2 = strchr((char *)(d->ops).sd_free,0x36);
        if (pcVar2 == (char *)0x0) {
          ptStack_28->af = 0;
        }
        else {
          ptStack_28->af = 4;
        }
      }
      else {
        ptStack_28->af = 3;
      }
      snprintf(ptStack_28->host,0x100,"%s",(d->ops).sd_stop);
      ptStack_28->port = (uint16_t)*(undefined4 *)&(d->ops).sd_dial;
      url_local->u_scheme = (char *)ptStack_28;
      dp_local._4_4_ = 0;
    }
  }
  return dp_local._4_4_;
}

Assistant:

int
nni_tcp_dialer_alloc(nng_stream_dialer **dp, const nng_url *url)
{
	tcp_dialer *d;
	int         rv;

	if ((rv = tcp_dialer_alloc(&d)) != 0) {
		return (rv);
	}

	if ((url->u_port == 0) || strlen(url->u_hostname) == 0 ||
	    strlen(url->u_hostname) >= sizeof(d->host)) {
		// Dialer needs both a destination hostname and port.
		tcp_dialer_free(d);
		return (NNG_EADDRINVAL);
	}

	if (strchr(url->u_scheme, '4') != NULL) {
		d->af = NNG_AF_INET;
	} else if (strchr(url->u_scheme, '6') != NULL) {
		d->af = NNG_AF_INET6;
	} else {
		d->af = NNG_AF_UNSPEC;
	}

	snprintf(d->host, sizeof(d->host), "%s", url->u_hostname);
	d->port = url->u_port;

	*dp = (void *) d;
	return (0);
}